

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::StreamingConcatenationExpression::serializeTo
          (StreamingConcatenationExpression *this,ASTSerializer *serializer)

{
  ASTSerializer *pAVar1;
  bool bVar2;
  Expression *__n;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  iterator local_78;
  StreamExpression *stream;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *local_50;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *__range3;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  ASTSerializer *local_18;
  ASTSerializer *serializer_local;
  StreamingConcatenationExpression *this_local;
  
  local_18 = serializer;
  serializer_local = (ASTSerializer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"sliceSize");
  ASTSerializer::write(serializer,(int)local_28._M_len,local_28._M_str,this->sliceSize);
  local_38 = streams(this);
  bVar2 = nonstd::span_lite::
          span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
          ::empty(&local_38);
  pAVar1 = local_18;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,"streams");
    ASTSerializer::startArray(pAVar1,___range3);
    ___begin3 = streams(this);
    local_50 = (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                *)&__begin3;
    __end3 = nonstd::span_lite::
             span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
             ::begin(local_50);
    stream = nonstd::span_lite::
             span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
             ::end(local_50);
    for (; __end3 != stream; __end3 = __end3 + 1) {
      local_78 = __end3;
      ASTSerializer::startObject(local_18);
      pAVar1 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"operand");
      __n = not_null<const_slang::ast::Expression_*>::operator*(&local_78->operand);
      ASTSerializer::write(pAVar1,(int)local_88._M_len,local_88._M_str,(size_t)__n);
      pAVar1 = local_18;
      if (local_78->withExpr != (Expression *)0x0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_98,"withExpr");
        ASTSerializer::write(pAVar1,(int)local_98._M_len,local_98._M_str,(size_t)local_78->withExpr)
        ;
      }
      ASTSerializer::endObject(local_18);
    }
    ASTSerializer::endArray(local_18);
  }
  return;
}

Assistant:

void StreamingConcatenationExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("sliceSize", sliceSize);
    if (!streams().empty()) {
        serializer.startArray("streams");
        for (auto& stream : streams()) {
            serializer.startObject();
            serializer.write("operand", *stream.operand);
            if (stream.withExpr)
                serializer.write("withExpr", *stream.withExpr);
            serializer.endObject();
        }
        serializer.endArray();
    }
}